

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueSymbol.cpp
# Opt level: O2

void __thiscall
slang::ast::ValueSymbol::addDriverFromSideEffect(ValueSymbol *this,ValueDriver *newDriver)

{
  Expression *prefixExpression;
  Type *rootType;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  EvalContext local_368;
  
  local_368.astCtx.scope.ptr = (this->super_Symbol).parentScope;
  local_368.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
       (pointer)local_368.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement;
  local_368.astCtx.instanceOrProc = (Symbol *)0x0;
  local_368.astCtx.firstTempVar = (TempVarSymbol *)0x0;
  local_368.astCtx.randomizeDetails = (RandomizeDetails *)0x0;
  local_368.astCtx.assertionInstance = (AssertionInstanceDetails *)0x0;
  local_368.astCtx.lookupIndex = 0xffffffff;
  local_368.astCtx.flags.m_bits = 0;
  local_368.flags.m_bits = '\0';
  local_368._60_8_ = 0;
  local_368._68_8_ = 0;
  local_368.queueTarget._4_4_ = 0;
  local_368.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
  local_368.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
  local_368.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
       (pointer)local_368.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
  local_368.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
  local_368.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
  local_368.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
  .data_ = (pointer)local_368.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_368.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
  .len = 0;
  local_368.diags.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>
  .cap = 2;
  local_368.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)local_368.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_368.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  local_368.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  local_368.backtraceReported = false;
  local_368.disableRange.startLoc = (SourceLocation)0x0;
  local_368.disableRange.endLoc = (SourceLocation)0x0;
  prefixExpression = (newDriver->prefixExpression).ptr;
  rootType = DeclaredType::getType(&this->declaredType);
  ValueDriver::getBounds(&bounds,prefixExpression,&local_368,rootType);
  if (bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>._M_payload.
      super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>._M_engaged != false) {
    addDriver(this,bounds.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value,newDriver);
  }
  EvalContext::~EvalContext(&local_368);
  return;
}

Assistant:

void ValueSymbol::addDriverFromSideEffect(const ValueDriver& newDriver) const {
    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    EvalContext evalCtx(ASTContext(*scope, LookupLocation::max));
    auto bounds = ValueDriver::getBounds(*newDriver.prefixExpression, evalCtx, getType());
    if (!bounds)
        return;

    addDriver(*bounds, newDriver);
}